

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result * __thiscall
pugi::xml_document::load_file
          (xml_parse_result *__return_storage_ptr__,xml_document *this,wchar_t *path_,uint options,
          xml_encoding encoding)

{
  auto_deleter<_IO_FILE> file;
  auto_deleter<_IO_FILE> local_38;
  
  reset(this);
  local_38.data = impl::anon_unknown_0::open_file_wide(path_,L"rb");
  local_38.deleter = impl::anon_unknown_0::close_file;
  impl::anon_unknown_0::load_file_impl
            (__return_storage_ptr__,(xml_document_struct *)(this->super_xml_node)._root,
             local_38.data,options,encoding,&this->_buffer);
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::~auto_deleter(&local_38);
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_document::load_file(const wchar_t* path_, unsigned int options, xml_encoding encoding)
	{
		reset();

		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(impl::open_file_wide(path_, L"rb"), impl::close_file);

		return impl::load_file_impl(static_cast<impl::xml_document_struct*>(_root), file.data, options, encoding, &_buffer);
	}